

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.cc
# Opt level: O3

int x509_digest_verify_init(EVP_MD_CTX *ctx,X509_ALGOR *sigalg,EVP_PKEY *pkey)

{
  int iVar1;
  int iVar2;
  EVP_MD *type;
  int line;
  int pkey_nid;
  int digest_nid;
  int local_30;
  int local_2c;
  
  iVar1 = OBJ_obj2nid((ASN1_OBJECT *)sigalg->algorithm);
  iVar2 = OBJ_find_sigid_algs(iVar1,&local_2c,&local_30);
  if (iVar2 == 0) {
    iVar2 = 0xc;
    iVar1 = 0xb8;
    line = 0x56;
  }
  else {
    iVar2 = EVP_PKEY_id((EVP_PKEY *)pkey);
    if (local_30 == iVar2) {
      if (local_2c == 0) {
        if (iVar1 == 0x3b5) {
          if (sigalg->parameter == (ASN1_TYPE *)0x0) {
            type = (EVP_MD *)0x0;
LAB_00212342:
            iVar1 = EVP_DigestVerifyInit
                              ((EVP_MD_CTX *)ctx,(EVP_PKEY_CTX **)0x0,type,(ENGINE *)0x0,
                               (EVP_PKEY *)pkey);
            return iVar1;
          }
          iVar2 = 0xb;
          iVar1 = 0x88;
          line = 0x6d;
        }
        else {
          if (iVar1 == 0x390) {
            iVar1 = x509_rsa_pss_to_ctx(ctx,sigalg,pkey);
            return iVar1;
          }
          iVar2 = 0xc;
          iVar1 = 0xb8;
          line = 0x72;
        }
      }
      else if ((local_2c == 0x101) || (local_2c == 4)) {
        iVar2 = 0xc;
        iVar1 = 0x6f;
        line = 0x62;
      }
      else if ((sigalg->parameter == (ASN1_TYPE *)0x0) || (sigalg->parameter->type == 5)) {
        type = (EVP_MD *)EVP_get_digestbynid(local_2c);
        if (type != (EVP_MD *)0x0) goto LAB_00212342;
        iVar2 = 0xc;
        iVar1 = 0xb7;
        line = 0x83;
      }
      else {
        iVar2 = 0xb;
        iVar1 = 0x88;
        line = 0x7c;
      }
    }
    else {
      iVar2 = 0xc;
      iVar1 = 0xbd;
      line = 0x5c;
    }
  }
  ERR_put_error(iVar2,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/algorithm.cc"
                ,line);
  return 0;
}

Assistant:

int x509_digest_verify_init(EVP_MD_CTX *ctx, const X509_ALGOR *sigalg,
                            EVP_PKEY *pkey) {
  // Convert the signature OID into digest and public key OIDs.
  int sigalg_nid = OBJ_obj2nid(sigalg->algorithm);
  int digest_nid, pkey_nid;
  if (!OBJ_find_sigid_algs(sigalg_nid, &digest_nid, &pkey_nid)) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_UNKNOWN_SIGNATURE_ALGORITHM);
    return 0;
  }

  // Check the public key OID matches the public key type.
  if (pkey_nid != EVP_PKEY_id(pkey)) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_WRONG_PUBLIC_KEY_TYPE);
    return 0;
  }

  // Check for permitted digest algorithms
  if (!x509_digest_nid_ok(digest_nid)) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_DIGEST_AND_KEY_TYPE_NOT_SUPPORTED);
    return 0;
  }

  // NID_undef signals that there are custom parameters to set.
  if (digest_nid == NID_undef) {
    if (sigalg_nid == NID_rsassaPss) {
      return x509_rsa_pss_to_ctx(ctx, sigalg, pkey);
    }
    if (sigalg_nid == NID_ED25519) {
      if (sigalg->parameter != NULL) {
        OPENSSL_PUT_ERROR(X509, X509_R_INVALID_PARAMETER);
        return 0;
      }
      return EVP_DigestVerifyInit(ctx, NULL, NULL, NULL, pkey);
    }
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_UNKNOWN_SIGNATURE_ALGORITHM);
    return 0;
  }

  // The parameter should be an explicit NULL for RSA and omitted for ECDSA. For
  // compatibility, we allow either for both algorithms. See b/167375496.
  //
  // TODO(davidben): Chromium's verifier allows both forms for RSA, but enforces
  // ECDSA more strictly. Align with Chromium and add a flag for b/167375496.
  if (sigalg->parameter != NULL && sigalg->parameter->type != V_ASN1_NULL) {
    OPENSSL_PUT_ERROR(X509, X509_R_INVALID_PARAMETER);
    return 0;
  }

  // Otherwise, initialize with the digest from the OID.
  const EVP_MD *digest = EVP_get_digestbynid(digest_nid);
  if (digest == NULL) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_UNKNOWN_MESSAGE_DIGEST_ALGORITHM);
    return 0;
  }

  return EVP_DigestVerifyInit(ctx, NULL, digest, NULL, pkey);
}